

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Hint.c
# Opt level: O1

int Llb_ManModelCheckAigWithHints(Aig_Man_t *pAigGlo,Gia_ParLlb_t *pPars)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  Aig_Man_t *pAVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *__ptr;
  Vec_Int_t *vHints;
  int *__s;
  long lVar7;
  long lVar8;
  int level;
  uint uVar9;
  ulong uVar10;
  DdManager *ddGlo;
  timespec ts;
  DdManager *local_50;
  Aig_Man_t *local_48;
  timespec local_40;
  
  local_50 = (DdManager *)0x0;
  local_48 = pAigGlo;
  iVar5 = clock_gettime(3,&local_40);
  pAVar4 = local_48;
  if (iVar5 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (pPars->nHintDepth < 1) {
    __assert_fail("pPars->nHintDepth > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Hint.c"
                  ,0xa9,"int Llb_ManModelCheckAigWithHints(Aig_Man_t *, Gia_ParLlb_t *)");
  }
  __ptr = Llb_ManCollectHighFanoutObjects(local_48,pPars->nHintDepth + pPars->HintFirst,1);
  iVar5 = pAVar4->vObjs->nSize;
  vHints = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar5 - 1U) {
    iVar6 = iVar5;
  }
  vHints->nSize = 0;
  vHints->nCap = iVar6;
  if (iVar6 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  vHints->pArray = __s;
  vHints->nSize = iVar5;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar5 << 2);
  }
  uVar1 = pPars->HintFirst;
  uVar10 = (ulong)uVar1;
  uVar2 = __ptr->nSize;
  if ((int)uVar1 < (int)uVar2) {
    do {
      if ((int)uVar1 < 0) goto LAB_0082b0a5;
      iVar5 = __ptr->pArray[uVar10];
      if (((long)iVar5 < 0) || (vHints->nSize <= iVar5)) goto LAB_0082b086;
      vHints->pArray[iVar5] = 1;
      iVar5 = Llb_ManModelCheckAig(local_48,pPars,vHints,&local_50);
      iVar6 = iVar5;
      if (iVar5 == 0) goto LAB_0082af88;
      if (iVar5 == 1) {
        uVar9 = (uint)uVar10;
        break;
      }
      uVar10 = uVar10 + 1;
      uVar9 = uVar2;
    } while ((int)uVar10 < (int)uVar2);
  }
  else {
    iVar5 = -1;
    uVar9 = uVar1;
  }
  iVar6 = -1;
  if ((iVar5 != -1) && (uVar1 = uVar9, iVar6 = iVar5, pPars->HintFirst <= (int)uVar9)) {
    do {
      if (((int)uVar1 < 0) || ((int)uVar2 <= (int)uVar9)) {
LAB_0082b0a5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = __ptr->pArray[uVar1];
      if (((long)iVar5 < 0) || (vHints->nSize <= iVar5)) {
LAB_0082b086:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vHints->pArray[iVar5] = -1;
      iVar6 = Llb_ManModelCheckAig(local_48,pPars,vHints,&local_50);
      if (iVar6 != 1) goto LAB_0082af88;
      bVar3 = pPars->HintFirst < (int)uVar1;
      uVar1 = uVar1 - 1;
    } while (bVar3);
    iVar6 = 1;
  }
LAB_0082af88:
  if (local_50 != (DdManager *)0x0) {
    if (local_50->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(local_50,local_50->bFunc);
    }
    Extra_StopManager(local_50);
  }
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (int *)0x0;
    }
    free(__ptr);
  }
  if (vHints->pArray != (int *)0x0) {
    free(vHints->pArray);
    vHints->pArray = (int *)0x0;
  }
  free(vHints);
  if (pPars->fVerbose != 0) {
    level = 3;
    iVar5 = clock_gettime(3,&local_40);
    if (iVar5 < 0) {
      lVar8 = -1;
    }
    else {
      lVar8 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Total runtime");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar8 + lVar7) / 1000000.0);
  }
  return iVar6;
}

Assistant:

int Llb_ManModelCheckAigWithHints( Aig_Man_t * pAigGlo, Gia_ParLlb_t * pPars )
{
    DdManager * ddGlo = NULL;
    Vec_Int_t * vHints;
    Vec_Int_t * vHFCands;
    int i, Entry, RetValue = -1;
    abctime clk = Abc_Clock();
    assert( pPars->nHintDepth > 0 );
/*
    // perform reachability without hints
    RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, NULL, NULL );
    if ( RetValue >= 0 )
        return RetValue;
*/
    // create hints representation
    vHFCands = Llb_ManCollectHighFanoutObjects( pAigGlo, pPars->nHintDepth+pPars->HintFirst, 1 );
    vHints   = Vec_IntStartFull( Aig_ManObjNumMax(pAigGlo) );
    // add one hint at a time till the problem is solved
    Vec_IntForEachEntryStart( vHFCands, Entry, i, pPars->HintFirst )
    {
        Vec_IntWriteEntry( vHints, Entry, 1 );   // change to 1 to start from zero cof!!!
        // solve under hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            break;
    }
    if ( RetValue == -1 )
        goto Finish;
    // undo the hints one at a time
    for ( ; i >= pPars->HintFirst; i-- )
    {
        Entry = Vec_IntEntry( vHFCands, i );
        Vec_IntWriteEntry( vHints, Entry, -1 );        
        // solve under relaxed hints
        RetValue = Llb_ManModelCheckAig( pAigGlo, pPars, vHints, &ddGlo );
        if ( RetValue == 0 )
            goto Finish;
        if ( RetValue == 1 )
            continue;
        break;
    }
Finish:
    if ( ddGlo )
    {
        if ( ddGlo->bFunc )
            Cudd_RecursiveDeref( ddGlo, ddGlo->bFunc ); 
        Extra_StopManager( ddGlo );
    }
    Vec_IntFreeP( &vHFCands );
    Vec_IntFreeP( &vHints );
    if ( pPars->fVerbose )
        Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clk );
    return RetValue;
}